

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

int __thiscall cmCTestMemCheckHandler::PreProcessHandler(cmCTestMemCheckHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  bVar1 = InitializeMemoryChecking(this);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = cmCTestTestHandler::ExecuteCommands
                      (&this->super_cmCTestTestHandler,&this->CustomPreMemCheck);
    if (iVar2 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "Problem executing pre-memcheck command(s).");
      std::endl<char,std::char_traits<char>>(poVar3);
      this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      iVar2 = 0;
      cmCTest::Log(this_00,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x97,local_1b0[0],false);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int cmCTestMemCheckHandler::PreProcessHandler()
{
  if (!this->InitializeMemoryChecking()) {
    return 0;
  }

  if (!this->ExecuteCommands(this->CustomPreMemCheck)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Problem executing pre-memcheck command(s)." << std::endl);
    return 0;
  }
  return 1;
}